

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O3

Result __thiscall
wabt::TypeChecker::OnIfExcept
          (TypeChecker *this,TypeVector *param_types,TypeVector *result_types,TypeVector *except_sig
          )

{
  Type *pTVar1;
  Result RVar2;
  Result RVar3;
  Type *pTVar4;
  unsigned_long local_40;
  LabelType local_38;
  Enum local_34;
  
  local_34 = (Enum)PopAndCheck1Type(this,ExceptRef,"if_except");
  RVar2 = PopAndCheckSignature(this,param_types,"if_except");
  local_38 = IfExcept;
  local_40 = (long)(this->type_stack_).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(this->type_stack_).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 2;
  std::vector<wabt::TypeChecker::Label,std::allocator<wabt::TypeChecker::Label>>::
  emplace_back<wabt::LabelType&,std::vector<wabt::Type,std::allocator<wabt::Type>>const&,std::vector<wabt::Type,std::allocator<wabt::Type>>const&,unsigned_long>
            ((vector<wabt::TypeChecker::Label,std::allocator<wabt::TypeChecker::Label>> *)
             &this->label_stack_,&local_38,param_types,result_types,&local_40);
  pTVar1 = (param_types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (pTVar4 = (param_types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
                super__Vector_impl_data._M_start; pTVar4 != pTVar1; pTVar4 = pTVar4 + 1) {
    PushType(this,*pTVar4);
  }
  pTVar1 = (except_sig->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (pTVar4 = (except_sig->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
                super__Vector_impl_data._M_start; pTVar4 != pTVar1; pTVar4 = pTVar4 + 1) {
    PushType(this,*pTVar4);
  }
  RVar3.enum_._1_3_ = 0;
  RVar3.enum_._0_1_ = RVar2.enum_ == Error || local_34 == Error;
  return (Result)RVar3.enum_;
}

Assistant:

Result TypeChecker::OnIfExcept(const TypeVector& param_types,
                               const TypeVector& result_types,
                               const TypeVector& except_sig) {
  Result result = PopAndCheck1Type(Type::ExceptRef, "if_except");
  result |= PopAndCheckSignature(param_types, "if_except");
  PushLabel(LabelType::IfExcept, param_types, result_types);
  // TODO(binji): Not quite sure how multi-value and exception proposals are
  // meant to interact here.
  PushTypes(param_types);
  PushTypes(except_sig);
  return result;
}